

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

XMLComment * __thiscall
tinyxml2::XMLDocument::CreateUnlinkedNode<tinyxml2::XMLComment,104>
          (XMLDocument *this,MemPoolT<104> *pool)

{
  int iVar1;
  undefined4 extraout_var;
  XMLComment *returnNode;
  MemPoolT<104> *pool_local;
  XMLDocument *this_local;
  XMLNode *t;
  
  iVar1 = (*(pool->super_MemPool)._vptr_MemPool[3])();
  t = (XMLNode *)CONCAT44(extraout_var,iVar1);
  XMLComment::XMLComment((XMLComment *)t,this);
  t->_memPool = &pool->super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::Push(&this->_unlinked,t);
  return (XMLComment *)t;
}

Assistant:

inline NodeType* XMLDocument::CreateUnlinkedNode( MemPoolT<PoolElementSize>& pool )
{
    TIXMLASSERT( sizeof( NodeType ) == PoolElementSize );
    TIXMLASSERT( sizeof( NodeType ) == pool.ItemSize() );
    NodeType* returnNode = new (pool.Alloc()) NodeType( this );
    TIXMLASSERT( returnNode );
    returnNode->_memPool = &pool;

	_unlinked.Push(returnNode);
    return returnNode;
}